

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.c
# Opt level: O0

int mbedtls_chacha20_self_test(int verbose)

{
  uint uVar1;
  int iVar2;
  uint local_19c;
  int ret;
  uint i;
  uchar output [381];
  int verbose_local;
  
  local_19c = 0;
  while( true ) {
    if (1 < local_19c) {
      if (verbose != 0) {
        printf(anon_var_dwarf_cfe9 + 8);
      }
      return 0;
    }
    if (verbose != 0) {
      printf("  ChaCha20 test %u ",(ulong)local_19c);
    }
    uVar1 = mbedtls_chacha20_crypt
                      (test_keys[local_19c],test_nonces[local_19c],test_counters[local_19c],
                       test_lengths[local_19c],test_input[local_19c],(uchar *)&ret);
    if (uVar1 != 0) break;
    iVar2 = memcmp(&ret,test_output + local_19c,test_lengths[local_19c]);
    if (iVar2 != 0) {
      if (verbose != 0) {
        printf("failed (output)\n");
      }
      return -1;
    }
    if (verbose != 0) {
      printf("passed\n");
    }
    local_19c = local_19c + 1;
  }
  if (verbose != 0) {
    printf("error code: %i\n",(ulong)uVar1);
  }
  return -1;
}

Assistant:

int mbedtls_chacha20_self_test( int verbose )
{
    unsigned char output[381];
    unsigned i;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    for( i = 0U; i < 2U; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  ChaCha20 test %u ", i );

        ret = mbedtls_chacha20_crypt( test_keys[i],
                                      test_nonces[i],
                                      test_counters[i],
                                      test_lengths[i],
                                      test_input[i],
                                      output );

        ASSERT( 0 == ret, ( "error code: %i\n", ret ) );

        ASSERT( 0 == memcmp( output, test_output[i], test_lengths[i] ),
                ( "failed (output)\n" ) );

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( 0 );
}